

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QUtil.cc
# Opt level: O0

int QUtil::call_main_from_wmain
              (int argc,wchar_t **argv,function<int_(int,_const_char_*const_*)> *realmain)

{
  int iVar1;
  function<int_(int,_const_char_*const_*)> local_60;
  function<int_(int,_char_**)> local_40;
  function<int_(int,_const_char_*const_*)> *local_20;
  function<int_(int,_const_char_*const_*)> *realmain_local;
  wchar_t **argv_local;
  int argc_local;
  
  local_20 = realmain;
  realmain_local = (function<int_(int,_const_char_*const_*)> *)argv;
  argv_local._4_4_ = argc;
  std::function<int_(int,_const_char_*const_*)>::function(&local_60,realmain);
  std::function<int(int,char**)>::
  function<QUtil::call_main_from_wmain(int,wchar_t_const*const*,std::function<int(int,char_const*const*)>)::__0,void>
            ((function<int(int,char**)> *)&local_40,(anon_class_32_1_b4b285d5 *)&local_60);
  iVar1 = ::call_main_from_wmain(true,argc,argv,&local_40);
  std::function<int_(int,_char_**)>::~function(&local_40);
  call_main_from_wmain(int,wchar_t_const*const*,std::function<int(int,char_const*const*)>)::$_0::
  ~__0((__0 *)&local_60);
  return iVar1;
}

Assistant:

int
QUtil::call_main_from_wmain(
    int argc, wchar_t const* const argv[], std::function<int(int, char const* const[])> realmain)
{
    return ::call_main_from_wmain(true, argc, argv, [realmain](int new_argc, char* new_argv[]) {
        return realmain(new_argc, new_argv);
    });
}